

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O1

int __thiscall
btHashMap<btHashString,_btCollisionShape_*>::findIndex
          (btHashMap<btHashString,_btCollisionShape_*> *this,btHashString *key)

{
  char *dst;
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = (long)(this->m_valueArray).m_capacity - 1U & (long)(int)key->m_hash;
  iVar3 = -1;
  if (((uint)uVar2 < (uint)(this->m_hashTable).m_size) &&
     (iVar3 = (this->m_hashTable).m_data[uVar2], iVar3 != -1)) {
    while( true ) {
      dst = (this->m_keyArray).m_data[iVar3].m_string;
      if (key->m_string == dst) break;
      iVar1 = btHashString::portableStringCompare(key,key->m_string,dst);
      if (iVar1 == 0) {
        return iVar3;
      }
      iVar3 = (this->m_next).m_data[iVar3];
      if (iVar3 == -1) {
        return -1;
      }
    }
  }
  return iVar3;
}

Assistant:

SIMD_FORCE_INLINE	unsigned int getHash()const
	{
		return m_hash;
	}